

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

Ivy_FraigMan_t * Ivy_FraigStart(Ivy_Man_t *pManAig,Ivy_FraigParams_t *pParams)

{
  Ivy_FraigSim_t *pIVar1;
  char *pcVar2;
  int iVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  Ivy_FraigMan_t *__s;
  Ivy_Man_t *pIVar8;
  char *__s_00;
  uint *puVar9;
  int *piVar10;
  Vec_Ptr_t *pVVar11;
  void **ppvVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  Ivy_FraigSim_t **ppIVar17;
  int iVar18;
  uint uVar19;
  
  lVar7 = (long)pManAig->vObjs->nSize;
  if (0 < lVar7) {
    lVar14 = 0;
    do {
      pvVar4 = pManAig->vObjs->pArray[lVar14];
      if ((pvVar4 != (void *)0x0) &&
         ((*(long *)((long)pvVar4 + 0x48) != 0 || (*(long *)((long)pvVar4 + 0x20) != 0)))) {
        __assert_fail("!pObj->pEquiv && !pObj->pFanout",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                      ,0x233,"Ivy_FraigMan_t *Ivy_FraigStart(Ivy_Man_t *, Ivy_FraigParams_t *)");
      }
      lVar14 = lVar14 + 1;
    } while (lVar7 != lVar14);
  }
  __s = (Ivy_FraigMan_t *)malloc(0x138);
  iVar18 = 0;
  memset(__s,0,0x138);
  __s->pParams = pParams;
  __s->pManAig = pManAig;
  pIVar8 = Ivy_ManStartFrom(pManAig);
  __s->pManFraig = pIVar8;
  iVar3 = pParams->nSimWords;
  __s->nSimWords = iVar3;
  iVar13 = pManAig->nCreated - pManAig->nDeleted;
  iVar15 = iVar3 * 4 + 0x20;
  __s_00 = (char *)malloc((long)(iVar13 * iVar15));
  __s->pSimWords = __s_00;
  memset(__s_00,0,(long)iVar15);
  lVar7 = (long)pManAig->vObjs->nSize;
  if (0 < lVar7) {
    ppvVar12 = pManAig->vObjs->pArray;
    lVar14 = 0;
    iVar18 = 0;
    do {
      pvVar4 = ppvVar12[lVar14];
      if (pvVar4 != (void *)0x0) {
        pIVar1 = (Ivy_FraigSim_t *)(__s_00 + iVar18 * iVar15);
        pcVar2 = __s_00 + (long)(iVar18 * iVar15) + 8;
        pcVar2[0] = '\0';
        pcVar2[1] = '\0';
        pcVar2[2] = '\0';
        pcVar2[3] = '\0';
        pcVar2[4] = '\0';
        pcVar2[5] = '\0';
        pcVar2[6] = '\0';
        pcVar2[7] = '\0';
        if ((*(uint *)((long)pvVar4 + 8) & 0xf) - 7 < 0xfffffffe) {
          pIVar1->pFanin0 = (Ivy_FraigSim_t *)0x0;
          pIVar1->pFanin1 = (Ivy_FraigSim_t *)0x0;
          uVar16 = 0;
        }
        else {
          ppIVar17 = (Ivy_FraigSim_t **)(__s_00 + (long)((iVar18 + -1) * iVar15) + 8);
          if (__s->pSimStart == (Ivy_FraigSim_t *)0x0) {
            ppIVar17 = &__s->pSimStart;
          }
          *ppIVar17 = pIVar1;
          uVar5 = *(ulong *)((long)pvVar4 + 0x10);
          pIVar1->pFanin0 = *(Ivy_FraigSim_t **)((uVar5 & 0xfffffffffffffffe) + 0x20);
          uVar6 = *(ulong *)((long)pvVar4 + 0x18);
          pIVar1->pFanin1 = *(Ivy_FraigSim_t **)((uVar6 & 0xfffffffffffffffe) + 0x20);
          if ((uVar5 & 1) == 0) {
            uVar16 = *(uint *)(uVar5 + 8) >> 7 & 1;
          }
          else {
            uVar16 = (uint)((*(byte *)((uVar5 & 0xfffffffffffffffe) + 8) & 0x80) == 0);
          }
          if ((uVar6 & 1) == 0) {
            uVar19 = *(uint *)(uVar6 + 8) >> 7 & 1;
          }
          else {
            uVar19 = (uint)((*(byte *)((uVar6 & 0xfffffffffffffffe) + 8) & 0x80) == 0);
          }
          uVar16 = *(uint *)((long)pvVar4 + 8) >> 7 & 1 | uVar16 * 4 + uVar19 * 2;
        }
        iVar18 = iVar18 + 1;
        pIVar1->Type = uVar16;
        *(Ivy_FraigSim_t **)((long)pvVar4 + 0x20) = pIVar1;
      }
      lVar14 = lVar14 + 1;
    } while (lVar7 != lVar14);
  }
  if (iVar18 == iVar13) {
    iVar13 = ((pManAig->nObjs[1] >> 5) + 1) - (uint)((pManAig->nObjs[1] & 0x1fU) == 0);
    __s->nPatWords = iVar13;
    puVar9 = (uint *)malloc((long)iVar13 << 2);
    __s->pPatWords = puVar9;
    piVar10 = (int *)malloc((long)iVar3 << 7);
    __s->pPatScores = piVar10;
    pVVar11 = (Vec_Ptr_t *)malloc(0x10);
    pVVar11->nCap = 100;
    pVVar11->nSize = 0;
    ppvVar12 = (void **)malloc(800);
    pVVar11->pArray = ppvVar12;
    __s->vPiVars = pVVar11;
    srand(0xabcabc);
    return __s;
  }
  __assert_fail("k == Ivy_ManObjNum(pManAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                ,599,"Ivy_FraigMan_t *Ivy_FraigStart(Ivy_Man_t *, Ivy_FraigParams_t *)");
}

Assistant:

Ivy_FraigMan_t * Ivy_FraigStart( Ivy_Man_t * pManAig, Ivy_FraigParams_t * pParams )
{
    Ivy_FraigMan_t * p;
    Ivy_FraigSim_t * pSims;
    Ivy_Obj_t * pObj;
    int i, k, EntrySize;
    // clean the fanout representation
    Ivy_ManForEachObj( pManAig, pObj, i )
//        pObj->pEquiv = pObj->pFanout = pObj->pNextFan0 = pObj->pNextFan1 = pObj->pPrevFan0 = pObj->pPrevFan1 = NULL;
        assert( !pObj->pEquiv && !pObj->pFanout );
    // allocat the fraiging manager
    p = ABC_ALLOC( Ivy_FraigMan_t, 1 );
    memset( p, 0, sizeof(Ivy_FraigMan_t) );
    p->pParams   = pParams;
    p->pManAig   = pManAig;
    p->pManFraig = Ivy_ManStartFrom( pManAig );
    // allocate simulation info
    p->nSimWords    = pParams->nSimWords;
//    p->pSimWords    = ABC_ALLOC( unsigned, Ivy_ManObjNum(pManAig) * p->nSimWords ); 
    EntrySize    = sizeof(Ivy_FraigSim_t) + sizeof(unsigned) * p->nSimWords;
    p->pSimWords = (char *)ABC_ALLOC( char, Ivy_ManObjNum(pManAig) * EntrySize ); 
    memset( p->pSimWords, 0, (size_t)EntrySize );
    k = 0;
    Ivy_ManForEachObj( pManAig, pObj, i )
    {
        pSims = (Ivy_FraigSim_t *)(p->pSimWords + EntrySize * k++);
        pSims->pNext = NULL;
        if ( Ivy_ObjIsNode(pObj) )
        {
            if ( p->pSimStart == NULL )
                p->pSimStart = pSims;
            else
                ((Ivy_FraigSim_t *)(p->pSimWords + EntrySize * (k-2)))->pNext = pSims;
            pSims->pFanin0 = Ivy_ObjSim( Ivy_ObjFanin0(pObj) );
            pSims->pFanin1 = Ivy_ObjSim( Ivy_ObjFanin1(pObj) );
            pSims->Type = (Ivy_ObjFaninPhase(Ivy_ObjChild0(pObj)) << 2) | (Ivy_ObjFaninPhase(Ivy_ObjChild1(pObj)) << 1) | pObj->fPhase;
        }
        else
        {
            pSims->pFanin0 = NULL;
            pSims->pFanin1 = NULL;
            pSims->Type = 0;
        }
        Ivy_ObjSetSim( pObj, pSims );
    }
    assert( k == Ivy_ManObjNum(pManAig) );
    // allocate storage for sim pattern
    p->nPatWords  = Ivy_BitWordNum( Ivy_ManPiNum(pManAig) );
    p->pPatWords  = ABC_ALLOC( unsigned, p->nPatWords ); 
    p->pPatScores = ABC_ALLOC( int, 32 * p->nSimWords ); 
    p->vPiVars    = Vec_PtrAlloc( 100 );
    // set random number generator
    srand( 0xABCABC );
    return p;
}